

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cc
# Opt level: O0

void __thiscall
leveldb::Iterator::RegisterCleanup(Iterator *this,CleanupFunction func,void *arg1,void *arg2)

{
  bool bVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  CleanupNode *node;
  undefined8 *local_28;
  
  bVar1 = CleanupNode::IsEmpty((CleanupNode *)(in_RDI + 8));
  if (bVar1) {
    local_28 = (undefined8 *)(in_RDI + 8);
  }
  else {
    local_28 = (undefined8 *)operator_new(0x20);
    memset(local_28,0,0x20);
    local_28[3] = *(undefined8 *)(in_RDI + 0x20);
    *(undefined8 **)(in_RDI + 0x20) = local_28;
  }
  *local_28 = in_RSI;
  local_28[1] = in_RDX;
  local_28[2] = in_RCX;
  return;
}

Assistant:

void Iterator::RegisterCleanup(CleanupFunction func, void* arg1, void* arg2) {
  assert(func != nullptr);
  CleanupNode* node;
  if (cleanup_head_.IsEmpty()) {
    node = &cleanup_head_;
  } else {
    node = new CleanupNode();
    node->next = cleanup_head_.next;
    cleanup_head_.next = node;
  }
  node->function = func;
  node->arg1 = arg1;
  node->arg2 = arg2;
}